

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualizer.cc
# Opt level: O0

Ptr __thiscall
features::Visualizer::draw_matches
          (Visualizer *this,ConstPtr *image1,ConstPtr *image2,Correspondences2D2D *matches)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  ImageBase *pIVar5;
  invalid_argument *this_00;
  int *piVar6;
  TypedImageBase<unsigned_char> *pTVar7;
  size_type sVar8;
  element_type *image;
  const_reference pvVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  double dVar10;
  Ptr PVar11;
  ulong local_78;
  size_t i;
  uchar *puStack_68;
  int y;
  uchar *img2_ptr;
  uchar *img1_ptr;
  uchar *out_ptr;
  int local_48;
  int out_height;
  int out_width;
  int img2_height;
  int img2_width;
  int img1_height;
  int img1_width;
  Correspondences2D2D *local_28;
  Correspondences2D2D *matches_local;
  ConstPtr *image2_local;
  ConstPtr *image1_local;
  Ptr *ret;
  
  local_28 = matches;
  matches_local = (Correspondences2D2D *)image2;
  image2_local = image1;
  image1_local = (ConstPtr *)this;
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image1);
  iVar4 = core::ImageBase::channels(pIVar5);
  if (iVar4 == 3) {
    pIVar5 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image2);
    iVar4 = core::ImageBase::channels(pIVar5);
    if (iVar4 == 3) {
      pIVar5 = (ImageBase *)
               std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image1);
      img2_width = core::ImageBase::width(pIVar5);
      pIVar5 = (ImageBase *)
               std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image1);
      img2_height = core::ImageBase::height(pIVar5);
      pIVar5 = (ImageBase *)
               std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image2);
      out_width = core::ImageBase::width(pIVar5);
      pIVar5 = (ImageBase *)
               std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image2);
      out_height = core::ImageBase::height(pIVar5);
      local_48 = img2_width + out_width;
      piVar6 = std::max<int>(&img2_height,&out_height);
      out_ptr._4_4_ = *piVar6;
      out_ptr._3_1_ = 0;
      core::Image<unsigned_char>::create((Image<unsigned_char> *)this,local_48,out_ptr._4_4_,3);
      pTVar7 = &std::
                __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this)->super_TypedImageBase<unsigned_char>;
      out_ptr._2_1_ = 0;
      core::TypedImageBase<unsigned_char>::fill(pTVar7,(uchar *)((long)&out_ptr + 2));
      pTVar7 = &std::
                __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this)->super_TypedImageBase<unsigned_char>;
      img1_ptr = core::TypedImageBase<unsigned_char>::begin(pTVar7);
      pTVar7 = &std::
                __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)image1)->super_TypedImageBase<unsigned_char>;
      img2_ptr = core::TypedImageBase<unsigned_char>::begin(pTVar7);
      pTVar7 = &std::
                __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)image2)->super_TypedImageBase<unsigned_char>;
      puStack_68 = core::TypedImageBase<unsigned_char>::begin(pTVar7);
      for (i._4_4_ = 0; i._4_4_ < out_ptr._4_4_; i._4_4_ = i._4_4_ + 1) {
        if (i._4_4_ < img2_height) {
          std::copy<unsigned_char_const*,unsigned_char*>
                    (img2_ptr,img2_ptr + img2_width * 3,img1_ptr);
          img2_ptr = img2_ptr + img2_width * 3;
        }
        iVar4 = img2_width * 3;
        if (i._4_4_ < out_height) {
          std::copy<unsigned_char_const*,unsigned_char*>
                    (puStack_68,puStack_68 + out_width * 3,img1_ptr + iVar4);
          puStack_68 = puStack_68 + out_width * 3;
        }
        img1_ptr = img1_ptr + iVar4 + out_width * 3;
      }
      for (local_78 = 0;
          sVar8 = std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::
                  size(local_28), local_78 < sVar8; local_78 = local_78 + 1) {
        image = std::
                __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        pvVar9 = std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::
                 operator[](local_28,local_78);
        dVar1 = pvVar9->p1[0];
        pvVar9 = std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::
                 operator[](local_28,local_78);
        dVar2 = pvVar9->p1[1];
        pvVar9 = std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::
                 operator[](local_28,local_78);
        dVar3 = pvVar9->p2[0];
        dVar10 = (double)img2_width;
        pvVar9 = std::vector<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>::
                 operator[](local_28,local_78);
        core::image::draw_line<unsigned_char>
                  (image,(int)dVar1,(int)dVar2,(int)(dVar3 + dVar10),(int)pvVar9->p2[1],
                   (anonymous_namespace)::color_table +
                   (local_78 + (local_78 / 3 & 0xfffffffffffffffc) * -3) * 3);
      }
      PVar11.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      PVar11.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Ptr)PVar11.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Only 3-channel images allowed");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

core::ByteImage::Ptr
Visualizer::draw_matches (core::ByteImage::ConstPtr image1,
    core::ByteImage::ConstPtr image2,
    sfm::Correspondences2D2D const& matches)
{
    if (image1->channels() != 3 || image2->channels() != 3)
        throw std::invalid_argument("Only 3-channel images allowed");

    int const img1_width = image1->width();
    int const img1_height = image1->height();
    int const img2_width = image2->width();
    int const img2_height = image2->height();
    int const out_width = img1_width + img2_width;
    int const out_height = std::max(img1_height, img2_height);

    core::ByteImage::Ptr ret = core::ByteImage::create(out_width, out_height, 3);
    ret->fill(0);

    /* Copy images into output image. */
    unsigned char* out_ptr = ret->begin();
    unsigned char const* img1_ptr = image1->begin();
    unsigned char const* img2_ptr = image2->begin();
    for (int y = 0; y < out_height; ++y)
    {
        if (y < img1_height)
        {
            std::copy(img1_ptr, img1_ptr + img1_width * 3, out_ptr);
            img1_ptr += img1_width * 3;
        }
        out_ptr += img1_width * 3;
        if (y < img2_height)
        {
            std::copy(img2_ptr, img2_ptr + img2_width * 3, out_ptr);
            img2_ptr += img2_width * 3;
        }
        out_ptr += img2_width * 3;
    }

    /* Draw matches. */
    for (std::size_t i = 0; i < matches.size(); ++i)
    {
        core::image::draw_line(*ret, matches[i].p1[0], matches[i].p1[1],
            matches[i].p2[0] + img1_width, matches[i].p2[1],
            color_table[i % 12]);
    }

    return ret;
}